

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

void __thiscall ncnn::Proposal::Proposal(Proposal *this)

{
  Mat *this_00;
  undefined8 *puVar1;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Proposal_00132110;
  this_00 = &this->ratios;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  memset(this_00,0,0x90);
  Mat::create(this_00,3,4);
  puVar1 = (undefined8 *)this_00->data;
  *puVar1 = 0x3f8000003f000000;
  *(undefined4 *)(puVar1 + 1) = 0x40000000;
  Mat::create(&this->scales,3,4);
  puVar1 = (undefined8 *)(this->scales).data;
  *puVar1 = 0x4180000041000000;
  *(undefined4 *)(puVar1 + 1) = 0x42000000;
  return;
}

Assistant:

Proposal::Proposal()
{
    one_blob_only = false;
    support_inplace = false;

    // TODO load from param
    ratios.create(3);
    ratios[0] = 0.5f;
    ratios[1] = 1.f;
    ratios[2] = 2.f;

    scales.create(3);
    scales[0] = 8.f;
    scales[1] = 16.f;
    scales[2] = 32.f;
}